

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  handle local_78;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>> local_70 [8]
  ;
  handle local_68;
  handle local_60;
  object local_58;
  object local_50;
  PyObject *local_48;
  char *local_40;
  object local_38;
  
  cpp_function::name((cpp_function *)&local_78);
  local_68.m_ptr = (cls->super_handle).m_ptr;
  if (local_78.m_ptr != (PyObject *)0x0) {
    (local_78.m_ptr)->ob_refcnt = (local_78.m_ptr)->ob_refcnt + 1;
  }
  local_60.m_ptr = local_78.m_ptr;
  local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_50);
  accessor_policies::obj_attr::set
            (local_68,local_60,(cf->super_function).super_object.super_handle.m_ptr);
  object::~object(&local_58);
  object::~object((object *)&local_60);
  object::~object((object *)&local_78);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_68.m_ptr = (cls->super_handle).m_ptr;
    local_60.m_ptr = (PyObject *)0x13d271;
    local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>(local_70,(char (*) [9])"__hash__");
    bVar1 = !bVar1;
    object::~object(&local_58);
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_48 = (cls->super_handle).m_ptr;
    local_40 = "__hash__";
    local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor_policies::str_attr::set((handle)local_48,"__hash__",(PyObject *)&_Py_NoneStruct);
    object::~object(&local_38);
    object::~object((object *)&local_78);
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}